

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamHttp_p.cpp
# Opt level: O2

void __thiscall BamTools::Internal::BamHttp::ParseUrl(BamHttp *this,string *url)

{
  int iVar1;
  long lVar2;
  size_t i;
  size_type sVar3;
  string tempUrl;
  string filename;
  string hostname;
  string out;
  
  this->m_isUrlParsed = false;
  std::__cxx11::string::string((string *)&tempUrl,(string *)url);
  out._M_dataplus._M_p = (pointer)&out.field_2;
  out._M_string_length = 0;
  out.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)&out);
  for (sVar3 = 0; tempUrl._M_string_length != sVar3; sVar3 = sVar3 + 1) {
    iVar1 = tolower((int)tempUrl._M_dataplus._M_p[sVar3]);
    out._M_dataplus._M_p[sVar3] = (char)iVar1;
  }
  std::__cxx11::string::~string((string *)&out);
  lVar2 = std::__cxx11::string::find((string *)&tempUrl,0x175328);
  if (lVar2 != -1) {
    std::__cxx11::string::find((char)&tempUrl,0x2f);
    std::__cxx11::string::substr((ulong)&hostname,(ulong)&tempUrl);
    lVar2 = std::__cxx11::string::find((char)&hostname,0x3a);
    if (lVar2 == -1) {
      std::__cxx11::string::_M_assign((string *)&this->m_hostname);
      std::__cxx11::string::_M_assign((string *)&this->m_port);
    }
    std::__cxx11::string::substr((ulong)&filename,(ulong)&tempUrl);
    if (filename._M_string_length != 0) {
      std::__cxx11::string::_M_assign((string *)&this->m_filename);
      this->m_isUrlParsed = true;
    }
    std::__cxx11::string::~string((string *)&filename);
    std::__cxx11::string::~string((string *)&hostname);
  }
  std::__cxx11::string::~string((string *)&tempUrl);
  return;
}

Assistant:

void BamHttp::ParseUrl(const string& url) {

    // clear flag to start
    m_isUrlParsed = false;

    // make sure url starts with "http://", case-insensitive
    string tempUrl(url);
    toLower(tempUrl);
    const size_t prefixFound = tempUrl.find(HTTP_PREFIX);
    if ( prefixFound == string::npos )
        return;

    // find end of host name portion (first '/' hit after the prefix)
    const size_t firstSlashFound = tempUrl.find(HOST_SEPARATOR, HTTP_PREFIX_LENGTH);
    if ( firstSlashFound == string::npos ) {
        ;  // no slash found... no filename given along with host?
    }

    // fetch hostname (check for proxy port)
    string hostname = tempUrl.substr(HTTP_PREFIX_LENGTH, (firstSlashFound - HTTP_PREFIX_LENGTH));
    const size_t colonFound = hostname.find(PROXY_SEPARATOR);
    if ( colonFound != string::npos ) {
        ; // TODO: handle proxy port (later, just skip for now)
    } else {
        m_hostname = hostname;
        m_port = HTTP_PORT;
    }

    // store remainder of URL as filename (must be non-empty)
    string filename = tempUrl.substr(firstSlashFound);
    if ( filename.empty() )
        return;
    m_filename = filename;

    // set parsed OK flag
    m_isUrlParsed = true;
}